

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::BatchLoader::~BatchLoader(BatchLoader *this)

{
  aiScene *this_00;
  BatchData *this_01;
  bool bVar1;
  reference pLVar2;
  _Self local_20;
  _Self local_18;
  LoadReqIt it;
  BatchLoader *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::begin
                 (&this->m_data->requests);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::end
                   (&this->m_data->requests);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pLVar2 = std::_List_iterator<Assimp::LoadRequest>::operator*(&local_18);
    this_00 = pLVar2->scene;
    if (this_00 != (aiScene *)0x0) {
      aiScene::~aiScene(this_00);
      operator_delete(this_00,0x80);
    }
    std::_List_iterator<Assimp::LoadRequest>::operator++(&local_18);
  }
  this_01 = this->m_data;
  if (this_01 != (BatchData *)0x0) {
    BatchData::~BatchData(this_01);
    operator_delete(this_01,0x50);
  }
  return;
}

Assistant:

BatchLoader::~BatchLoader()
{
    // delete all scenes what have not been polled by the user
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        delete (*it).scene;
    }
    delete m_data;
}